

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O2

unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>
 __thiscall absl::lts_20240722::flags_internal::FlagImpl::SaveState(FlagImpl *this)

{
  FlagOpFn op;
  bool bVar1;
  uint uVar2;
  atomic<long> *paVar3;
  void *dst;
  atomic<unsigned_long> *src;
  void *size;
  atomic<absl::lts_20240722::flags_internal::MaskedPointer> *paVar4;
  char *pcVar5;
  FlagImpl *in_RSI;
  bool on_command_line;
  bool modified;
  void *cloned;
  char *local_40;
  char *local_38;
  MutexLock l;
  
  l.mu_ = DataGuard(in_RSI);
  absl::lts_20240722::Mutex::Lock();
  modified = (bool)((byte)in_RSI->field_0x29 >> 2 & 1);
  on_command_line = (bool)((byte)in_RSI->field_0x29 >> 3 & 1);
  uVar2 = *(uint *)&in_RSI->field_0x28 >> 1 & 3;
  if (uVar2 < 2) {
    paVar3 = OneWordValue(in_RSI);
    local_40 = (char *)(paVar3->super___atomic_base<long>)._M_i;
    local_38 = (char *)SequenceLock::ModificationCount(&in_RSI->seq_lock_);
    std::
    make_unique<absl::lts_20240722::flags_internal::FlagState,absl::lts_20240722::flags_internal::FlagImpl&,long,bool&,bool&,long>
              ((FlagImpl *)&cloned,(long *)in_RSI,(bool *)&stack0xffffffffffffffc0,&modified,
               (long *)&on_command_line);
    pcVar5 = (char *)cloned;
  }
  else if (uVar2 == 2) {
    dst = (*in_RSI->op_)(kAlloc,(void *)0x0,(void *)0x0,(void *)0x0);
    cloned = dst;
    src = AtomicBufferValue(in_RSI);
    size = (*in_RSI->op_)(kSizeof,(void *)0x0,(void *)0x0,(void *)0x0);
    bVar1 = SequenceLock::TryRead(&in_RSI->seq_lock_,dst,src,(size_t)size);
    if (!bVar1) {
      __assert_fail("success",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/flags/internal/flag.cc"
                    ,0x1bd,
                    "virtual std::unique_ptr<FlagStateInterface> absl::flags_internal::FlagImpl::SaveState()"
                   );
    }
    local_38 = (char *)SequenceLock::ModificationCount(&in_RSI->seq_lock_);
    std::
    make_unique<absl::lts_20240722::flags_internal::FlagState,absl::lts_20240722::flags_internal::FlagImpl&,void*&,bool&,bool&,long>
              ((FlagImpl *)&stack0xffffffffffffffc0,(void **)in_RSI,(bool *)&cloned,&modified,
               (long *)&on_command_line);
    pcVar5 = local_40;
  }
  else {
    op = in_RSI->op_;
    paVar4 = PtrStorage(in_RSI);
    local_40 = (char *)Clone(op,(void *)((ulong)(paVar4->_M_i).ptr_ & 0xfffffffffffffffc));
    local_38 = (char *)SequenceLock::ModificationCount(&in_RSI->seq_lock_);
    std::
    make_unique<absl::lts_20240722::flags_internal::FlagState,absl::lts_20240722::flags_internal::FlagImpl&,void*,bool&,bool&,long>
              ((FlagImpl *)&cloned,(void **)in_RSI,(bool *)&stack0xffffffffffffffc0,&modified,
               (long *)&on_command_line);
    pcVar5 = (char *)cloned;
  }
  *(char **)this = pcVar5;
  MutexLock::~MutexLock(&l);
  return (__uniq_ptr_data<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>,_true,_true>
          )(__uniq_ptr_data<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FlagStateInterface> FlagImpl::SaveState() {
  absl::MutexLock l(DataGuard());

  bool modified = modified_;
  bool on_command_line = on_command_line_;
  switch (ValueStorageKind()) {
    case FlagValueStorageKind::kValueAndInitBit:
    case FlagValueStorageKind::kOneWordAtomic: {
      return absl::make_unique<FlagState>(
          *this, OneWordValue().load(std::memory_order_acquire), modified,
          on_command_line, ModificationCount());
    }
    case FlagValueStorageKind::kSequenceLocked: {
      void* cloned = flags_internal::Alloc(op_);
      // Read is guaranteed to be successful because we hold the lock.
      bool success =
          seq_lock_.TryRead(cloned, AtomicBufferValue(), Sizeof(op_));
      assert(success);
      static_cast<void>(success);
      return absl::make_unique<FlagState>(*this, cloned, modified,
                                          on_command_line, ModificationCount());
    }
    case FlagValueStorageKind::kHeapAllocated: {
      return absl::make_unique<FlagState>(
          *this,
          flags_internal::Clone(
              op_, PtrStorage().load(std::memory_order_acquire).Ptr()),
          modified, on_command_line, ModificationCount());
    }
  }
  return nullptr;
}